

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Persistence_landscape.h
# Opt level: O3

Persistence_landscape * __thiscall
Gudhi::Persistence_representations::operation_on_pair_of_landscapes<std::plus<double>>
          (Persistence_landscape *__return_storage_ptr__,Persistence_representations *this,
          Persistence_landscape *land1,Persistence_landscape *land2)

{
  pointer *pppVar1;
  double dVar2;
  pointer ppVar3;
  pointer ppVar4;
  pointer ppVar5;
  Persistence_landscape *pPVar6;
  Persistence_representations *pPVar7;
  ulong uVar8;
  pointer pvVar9;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  long lVar13;
  pointer pvVar14;
  long lVar15;
  ulong uVar16;
  long lVar17;
  long lVar18;
  ulong uVar19;
  size_t i;
  ulong uVar20;
  double dVar21;
  vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> lambda_n;
  vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
  land;
  vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> local_98;
  pair<double,_double> local_78;
  Persistence_landscape *local_60;
  Persistence_representations *local_58;
  ulong local_50;
  vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
  local_48;
  
  (__return_storage_ptr__->land).
  super__Vector_base<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __return_storage_ptr__->number_of_functions_for_vectorization = 0;
  (__return_storage_ptr__->land).
  super__Vector_base<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->land).
  super__Vector_base<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  __return_storage_ptr__->number_of_functions_for_projections_to_reals = 0;
  uVar8 = (*(long *)(this + 8) - *(long *)this >> 3) * -0x5555555555555555;
  lVar11 = (long)(land1->land).
                 super__Vector_base<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(land1->land).
                 super__Vector_base<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 3;
  uVar12 = lVar11 * -0x5555555555555555;
  if (uVar12 <= uVar8 && uVar8 + lVar11 * 0x5555555555555555 != 0) {
    uVar12 = uVar8;
  }
  std::
  vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
  ::vector(&local_48,uVar12,(allocator_type *)&local_98);
  std::
  vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
  ::operator=(&__return_storage_ptr__->land,&local_48);
  uVar12 = 0;
  local_60 = __return_storage_ptr__;
  local_58 = this;
  do {
    lVar11 = *(long *)this;
    lVar15 = *(long *)(this + 8);
    uVar20 = lVar15 - lVar11;
    uVar19 = ((long)uVar20 >> 3) * -0x5555555555555555;
    pvVar9 = (land1->land).
             super__Vector_base<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pvVar14 = (land1->land).
              super__Vector_base<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    uVar16 = (long)pvVar14 - (long)pvVar9;
    uVar10 = ((long)uVar16 >> 3) * -0x5555555555555555;
    uVar8 = uVar19;
    if (uVar10 < uVar19) {
      uVar8 = uVar10;
    }
    if (uVar12 == uVar8) {
      if (uVar10 < uVar19) {
        uVar20 = lVar15 - lVar11;
        uVar8 = ((long)uVar20 >> 3) * -0x5555555555555555;
        uVar16 = (long)pvVar14 - (long)pvVar9;
        uVar12 = ((long)uVar16 >> 3) * -0x5555555555555555;
        if (uVar12 <= uVar8 && uVar8 + ((long)uVar16 >> 3) * 0x5555555555555555 != 0) {
          uVar12 = uVar8;
        }
        if (uVar10 - uVar12 != 0) {
          do {
            std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
            vector(&local_98,
                   (vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> *
                   )(lVar11 + uVar10 * 0x18));
            pPVar7 = local_58;
            lVar11 = *(long *)local_58;
            lVar15 = *(long *)(lVar11 + uVar10 * 0x18);
            lVar13 = *(long *)(lVar11 + 8 + uVar10 * 0x18) - lVar15;
            if (lVar13 != 0) {
              lVar13 = lVar13 >> 4;
              lVar18 = 8;
              do {
                dVar2 = *(double *)(lVar15 + lVar18);
                *(undefined8 *)
                 ((long)local_98.
                        super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + lVar18 + -8) =
                     *(undefined8 *)(lVar15 + -8 + lVar18);
                *(double *)
                 ((long)&(local_98.
                          super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->first + lVar18) = dVar2 + 0.0;
                lVar18 = lVar18 + 0x10;
                lVar13 = lVar13 + -1;
              } while (lVar13 != 0);
            }
            pvVar14 = (local_60->land).
                      super__Vector_base<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            ppVar3 = *(pointer *)
                      &pvVar14[uVar10].
                       super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                       ._M_impl;
            ppVar4 = *(pointer *)
                      ((long)&pvVar14[uVar10].
                              super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                              ._M_impl + 8);
            ppVar5 = *(pointer *)
                      ((long)&pvVar14[uVar10].
                              super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                              ._M_impl + 0x10);
            *(pointer *)
             &pvVar14[uVar10].
              super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
              ._M_impl = local_98.
                         super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
            pppVar1 = (pointer *)
                      ((long)&pvVar14[uVar10].
                              super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                              ._M_impl + 8);
            *pppVar1 = local_98.
                       super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
            pppVar1[1] = local_98.
                         super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage;
            local_98.
            super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
            ._M_impl.super__Vector_impl_data._M_start = ppVar3;
            local_98.
            super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = ppVar4;
            local_98.
            super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = ppVar5;
            if (ppVar3 != (pointer)0x0) {
              operator_delete(ppVar3,(long)ppVar5 - (long)ppVar3);
              lVar11 = *(long *)pPVar7;
            }
            uVar10 = uVar10 + 1;
            lVar15 = *(long *)(pPVar7 + 8);
            pvVar9 = (land1->land).
                     super__Vector_base<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            pvVar14 = (land1->land).
                      super__Vector_base<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
            uVar20 = lVar15 - lVar11;
            uVar8 = ((long)uVar20 >> 3) * -0x5555555555555555;
            uVar16 = (long)pvVar14 - (long)pvVar9;
            uVar12 = ((long)uVar16 >> 3) * -0x5555555555555555;
            if (uVar12 <= uVar8 && uVar8 + ((long)uVar16 >> 3) * 0x5555555555555555 != 0) {
              uVar12 = uVar8;
            }
          } while (uVar10 != uVar12);
        }
      }
      pPVar6 = local_60;
      if (uVar20 < uVar16) {
        uVar10 = ((long)uVar20 >> 3) * -0x5555555555555555;
        uVar8 = (lVar15 - lVar11 >> 3) * -0x5555555555555555;
        lVar11 = (long)pvVar14 - (long)pvVar9 >> 3;
        uVar12 = lVar11 * -0x5555555555555555;
        if (uVar12 <= uVar8 && uVar8 + lVar11 * 0x5555555555555555 != 0) {
          uVar12 = uVar8;
        }
        if (uVar10 - uVar12 != 0) {
          do {
            std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
            vector(&local_98,pvVar9 + uVar10);
            pvVar9 = (land1->land).
                     super__Vector_base<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            lVar11 = *(long *)&pvVar9[uVar10].
                               super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                               ._M_impl;
            lVar15 = (long)*(pointer *)
                            ((long)&pvVar9[uVar10].
                                    super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                                    ._M_impl + 8) - lVar11;
            if (lVar15 != 0) {
              lVar15 = lVar15 >> 4;
              lVar13 = 8;
              do {
                dVar2 = *(double *)(lVar11 + lVar13);
                *(undefined8 *)
                 ((long)local_98.
                        super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + lVar13 + -8) =
                     *(undefined8 *)(lVar11 + -8 + lVar13);
                *(double *)
                 ((long)&(local_98.
                          super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->first + lVar13) = dVar2 + 0.0;
                lVar13 = lVar13 + 0x10;
                lVar15 = lVar15 + -1;
              } while (lVar15 != 0);
            }
            pvVar14 = (pPVar6->land).
                      super__Vector_base<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            ppVar3 = *(pointer *)
                      &pvVar14[uVar10].
                       super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                       ._M_impl;
            ppVar4 = *(pointer *)
                      ((long)&pvVar14[uVar10].
                              super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                              ._M_impl + 8);
            ppVar5 = *(pointer *)
                      ((long)&pvVar14[uVar10].
                              super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                              ._M_impl + 0x10);
            *(pointer *)
             &pvVar14[uVar10].
              super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
              ._M_impl = local_98.
                         super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
            pppVar1 = (pointer *)
                      ((long)&pvVar14[uVar10].
                              super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                              ._M_impl + 8);
            *pppVar1 = local_98.
                       super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
            pppVar1[1] = local_98.
                         super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage;
            local_98.
            super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
            ._M_impl.super__Vector_impl_data._M_start = ppVar3;
            local_98.
            super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = ppVar4;
            local_98.
            super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = ppVar5;
            if (ppVar3 != (pointer)0x0) {
              operator_delete(ppVar3,(long)ppVar5 - (long)ppVar3);
              pvVar9 = (land1->land).
                       super__Vector_base<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
            }
            uVar10 = uVar10 + 1;
            uVar8 = (*(long *)(local_58 + 8) - *(long *)local_58 >> 3) * -0x5555555555555555;
            lVar11 = (long)(land1->land).
                           super__Vector_base<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar9 >> 3;
            uVar12 = lVar11 * -0x5555555555555555;
            if (uVar12 <= uVar8 && uVar8 + lVar11 * 0x5555555555555555 != 0) {
              uVar12 = uVar8;
            }
          } while (uVar10 != uVar12);
        }
      }
      std::
      vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
      ::~vector(&local_48);
      return pPVar6;
    }
    local_98.
    super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_98.
    super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pair<double,_double> *)0x0;
    local_98.
    super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    lVar15 = *(long *)(lVar11 + uVar12 * 0x18);
    lVar13 = *(long *)(lVar11 + 8 + uVar12 * 0x18);
    uVar8 = lVar13 - lVar15;
    local_50 = uVar12;
    if (uVar8 < 0x11) {
      uVar10 = 0;
      uVar16 = 0;
    }
    else {
      pvVar14 = (land1->land).
                super__Vector_base<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      lVar13 = *(long *)&pvVar14[uVar12].
                         super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                         ._M_impl;
      if ((ulong)((long)*(pointer *)
                         ((long)&pvVar14[uVar12].
                                 super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                                 ._M_impl + 8) - lVar13) < 0x11) {
        uVar10 = 0;
        uVar16 = 0;
      }
      else {
        uVar19 = 1;
        uVar10 = 0;
        uVar8 = 1;
        uVar20 = 0;
        do {
          while( true ) {
            uVar16 = uVar8;
            lVar17 = uVar20 * 0x10;
            lVar11 = lVar15 + lVar17;
            dVar2 = *(double *)(lVar15 + lVar17);
            lVar18 = lVar13 + uVar10 * 0x10;
            local_78.first = *(double *)(lVar13 + uVar10 * 0x10);
            if (local_78.first <= dVar2) break;
            dVar21 = (*(double *)(lVar18 + 8) - *(double *)(lVar18 + -8)) /
                     (local_78.first - *(double *)(lVar18 + -0x10));
            local_78.second =
                 dVar21 * dVar2 + (*(double *)(lVar18 + -8) - *(double *)(lVar18 + -0x10) * dVar21)
                 + *(double *)(lVar11 + 8);
            if (local_98.
                super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                ._M_impl.super__Vector_impl_data._M_finish ==
                local_98.
                super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
              local_78.first = dVar2;
              std::vector<std::pair<double,double>,std::allocator<std::pair<double,double>>>::
              _M_realloc_insert<std::pair<double,double>>
                        ((vector<std::pair<double,double>,std::allocator<std::pair<double,double>>>
                          *)&local_98,
                         (iterator)
                         local_98.
                         super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish,&local_78);
            }
            else {
              (local_98.
               super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
               ._M_impl.super__Vector_impl_data._M_finish)->first = dVar2;
              (local_98.
               super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
               ._M_impl.super__Vector_impl_data._M_finish)->second = local_78.second;
              local_98.
              super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
              ._M_impl.super__Vector_impl_data._M_finish =
                   local_98.
                   super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish + 1;
            }
            lVar11 = *(long *)local_58;
            lVar15 = *(long *)(lVar11 + uVar12 * 0x18);
            lVar13 = *(long *)(lVar11 + 8 + uVar12 * 0x18);
            uVar8 = lVar13 - lVar15;
            if ((ulong)((long)uVar8 >> 4) <= uVar16 + 1) goto LAB_00107923;
            pvVar14 = (land1->land).
                      super__Vector_base<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            lVar13 = *(long *)&pvVar14[uVar12].
                               super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                               ._M_impl;
            uVar8 = uVar16 + 1;
            uVar20 = uVar16;
            if ((ulong)((long)*(pointer *)
                               ((long)&pvVar14[uVar12].
                                       super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                                       ._M_impl + 8) - lVar13 >> 4) <= uVar19) goto LAB_00107914;
          }
          if (dVar2 <= local_78.first) {
            if ((dVar2 == local_78.first) && (!NAN(dVar2) && !NAN(local_78.first))) {
              local_78.second = *(double *)(lVar15 + 8 + lVar17) + *(double *)(lVar18 + 8);
              if (local_98.
                  super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish ==
                  local_98.
                  super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                std::vector<std::pair<double,double>,std::allocator<std::pair<double,double>>>::
                _M_realloc_insert<std::pair<double,double>>
                          ((vector<std::pair<double,double>,std::allocator<std::pair<double,double>>>
                            *)&local_98,
                           (iterator)
                           local_98.
                           super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish,&local_78);
                uVar10 = uVar19;
                uVar20 = uVar16;
              }
              else {
                (local_98.
                 super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish)->first = local_78.first;
                (local_98.
                 super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish)->second = local_78.second;
                local_98.
                super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                ._M_impl.super__Vector_impl_data._M_finish =
                     local_98.
                     super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish + 1;
                uVar10 = uVar19;
                uVar20 = uVar16;
              }
            }
          }
          else {
            dVar21 = (*(double *)(lVar11 + -8) - *(double *)(lVar11 + 8)) /
                     (*(double *)(lVar11 + -0x10) - dVar2);
            local_78.second =
                 dVar21 * local_78.first + (*(double *)(lVar11 + 8) - dVar2 * dVar21) +
                 *(double *)(lVar18 + 8);
            if (local_98.
                super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                ._M_impl.super__Vector_impl_data._M_finish ==
                local_98.
                super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::vector<std::pair<double,double>,std::allocator<std::pair<double,double>>>::
              _M_realloc_insert<std::pair<double,double>>
                        ((vector<std::pair<double,double>,std::allocator<std::pair<double,double>>>
                          *)&local_98,
                         (iterator)
                         local_98.
                         super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish,&local_78);
              uVar10 = uVar19;
            }
            else {
              (local_98.
               super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
               ._M_impl.super__Vector_impl_data._M_finish)->first = local_78.first;
              (local_98.
               super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
               ._M_impl.super__Vector_impl_data._M_finish)->second = local_78.second;
              local_98.
              super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
              ._M_impl.super__Vector_impl_data._M_finish =
                   local_98.
                   super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish + 1;
              uVar10 = uVar19;
            }
          }
          uVar16 = uVar20;
          lVar11 = *(long *)local_58;
          lVar15 = *(long *)(lVar11 + uVar12 * 0x18);
          lVar13 = *(long *)(lVar11 + 8 + uVar12 * 0x18);
          uVar8 = lVar13 - lVar15;
          if ((ulong)((long)uVar8 >> 4) <= uVar16 + 1) goto LAB_00107923;
          uVar19 = uVar10 + 1;
          pvVar14 = (land1->land).
                    super__Vector_base<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          lVar13 = *(long *)&pvVar14[uVar12].
                             super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                             ._M_impl;
          uVar8 = uVar16 + 1;
          uVar20 = uVar16;
        } while (uVar19 < (ulong)((long)*(pointer *)
                                         ((long)&pvVar14[uVar12].
                                                 super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                                                 ._M_impl + 8) - lVar13 >> 4));
      }
LAB_00107914:
      lVar15 = *(long *)(lVar11 + uVar12 * 0x18);
      lVar13 = *(long *)(lVar11 + 8 + uVar12 * 0x18);
      uVar8 = lVar13 - lVar15;
    }
LAB_00107923:
    uVar19 = uVar16 + 1;
    uVar8 = (long)uVar8 >> 4;
    if (uVar19 < uVar8) {
      pvVar14 = (land1->land).
                super__Vector_base<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if ((ulong)((long)*(pointer *)
                         ((long)&pvVar14[uVar12].
                                 super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                                 ._M_impl + 8) -
                  *(long *)&pvVar14[uVar12].
                            super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                            ._M_impl >> 4) <= uVar10 + 1) {
        uVar16 = uVar16 << 4 | 8;
        do {
          local_78.second = *(double *)(lVar15 + uVar16) + 0.0;
          local_78.first = *(double *)(lVar15 + -8 + uVar16);
          if (local_98.
              super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
              ._M_impl.super__Vector_impl_data._M_finish ==
              local_98.
              super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<std::pair<double,double>,std::allocator<std::pair<double,double>>>::
            _M_realloc_insert<std::pair<double,double>>
                      ((vector<std::pair<double,double>,std::allocator<std::pair<double,double>>> *)
                       &local_98,
                       (iterator)
                       local_98.
                       super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish,&local_78);
          }
          else {
            (local_98.
             super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
             ._M_impl.super__Vector_impl_data._M_finish)->first = local_78.first;
            (local_98.
             super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
             ._M_impl.super__Vector_impl_data._M_finish)->second = local_78.second;
            local_98.
            super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
            ._M_impl.super__Vector_impl_data._M_finish =
                 local_98.
                 super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish + 1;
          }
          uVar19 = uVar19 + 1;
          lVar15 = *(long *)(*(long *)local_58 + uVar12 * 0x18);
          lVar13 = *(long *)(*(long *)local_58 + 8 + uVar12 * 0x18);
          uVar8 = lVar13 - lVar15 >> 4;
          if (uVar8 <= uVar19) goto LAB_001079f0;
          pvVar14 = (land1->land).
                    super__Vector_base<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          uVar16 = uVar16 + 0x10;
        } while ((ulong)((long)*(pointer *)
                                ((long)&pvVar14[uVar12].
                                        super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                                        ._M_impl + 8) -
                         *(long *)&pvVar14[uVar12].
                                   super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                                   ._M_impl >> 4) <= uVar10 + 1);
      }
      uVar8 = lVar13 - lVar15 >> 4;
    }
LAB_001079f0:
    this = local_58;
    if (uVar8 <= uVar19) {
      uVar8 = uVar10 << 4 | 8;
      do {
        uVar10 = uVar10 + 1;
        pvVar14 = (land1->land).
                  super__Vector_base<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        lVar11 = *(long *)&pvVar14[uVar12].
                           super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                           ._M_impl;
        if ((ulong)((long)*(pointer *)
                           ((long)&pvVar14[uVar12].
                                   super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                                   ._M_impl + 8) - lVar11 >> 4) <= uVar10) break;
        local_78.second = *(double *)(lVar11 + uVar8) + 0.0;
        local_78.first = *(double *)(lVar11 + -8 + uVar8);
        if (local_98.
            super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
            ._M_impl.super__Vector_impl_data._M_finish ==
            local_98.
            super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<std::pair<double,double>,std::allocator<std::pair<double,double>>>::
          _M_realloc_insert<std::pair<double,double>>
                    ((vector<std::pair<double,double>,std::allocator<std::pair<double,double>>> *)
                     &local_98,
                     (iterator)
                     local_98.
                     super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish,&local_78);
        }
        else {
          (local_98.
           super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
           ._M_impl.super__Vector_impl_data._M_finish)->first = local_78.first;
          (local_98.
           super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
           ._M_impl.super__Vector_impl_data._M_finish)->second = local_78.second;
          local_98.
          super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               local_98.
               super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
               ._M_impl.super__Vector_impl_data._M_finish + 1;
        }
        uVar8 = uVar8 + 0x10;
      } while ((ulong)(*(long *)(*(long *)this + 8 + uVar12 * 0x18) -
                       *(long *)(*(long *)this + uVar12 * 0x18) >> 4) <= uVar19);
    }
    pPVar6 = local_60;
    local_78.first = 2147483647.0;
    local_78.second = 0.0;
    if (local_98.
        super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>.
        _M_impl.super__Vector_impl_data._M_finish ==
        local_98.
        super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<std::pair<double,double>,std::allocator<std::pair<double,double>>>::
      _M_realloc_insert<std::pair<double,double>>
                ((vector<std::pair<double,double>,std::allocator<std::pair<double,double>>> *)
                 &local_98,
                 (iterator)
                 local_98.
                 super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish,&local_78);
    }
    else {
      (local_98.
       super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>.
       _M_impl.super__Vector_impl_data._M_finish)->first = 2147483647.0;
      (local_98.
       super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>.
       _M_impl.super__Vector_impl_data._M_finish)->second = 0.0;
      local_98.
      super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>.
      _M_impl.super__Vector_impl_data._M_finish =
           local_98.
           super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
           ._M_impl.super__Vector_impl_data._M_finish + 1;
    }
    pvVar14 = (pPVar6->land).
              super__Vector_base<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    ppVar3 = *(pointer *)
              &pvVar14[uVar12].
               super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
               ._M_impl;
    ppVar4 = *(pointer *)
              ((long)&pvVar14[uVar12].
                      super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                      ._M_impl + 8);
    ppVar5 = *(pointer *)
              ((long)&pvVar14[uVar12].
                      super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                      ._M_impl + 0x10);
    *(pointer *)
     &pvVar14[uVar12].
      super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>.
      _M_impl = local_98.
                super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
    *(pointer *)
     ((long)&pvVar14[uVar12].
             super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
             ._M_impl + 8) =
         local_98.
         super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    *(pointer *)
     ((long)&pvVar14[uVar12].
             super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
             ._M_impl + 0x10) =
         local_98.
         super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage;
    local_98.
    super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>.
    _M_impl.super__Vector_impl_data._M_start = ppVar3;
    local_98.
    super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>.
    _M_impl.super__Vector_impl_data._M_finish = ppVar4;
    local_98.
    super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = ppVar5;
    if (ppVar3 != (pointer)0x0) {
      operator_delete(ppVar3,(long)ppVar5 - (long)ppVar3);
    }
    uVar12 = local_50 + 1;
  } while( true );
}

Assistant:

Persistence_landscape operation_on_pair_of_landscapes(const Persistence_landscape& land1,
                                                      const Persistence_landscape& land2) {
  bool operation_on_pair_of_landscapesDBG = false;
  if (operation_on_pair_of_landscapesDBG) {
    std::clog << "operation_on_pair_of_landscapes\n";
    std::cin.ignore();
  }
  Persistence_landscape result;
  std::vector<std::vector<std::pair<double, double> > > land(std::max(land1.land.size(), land2.land.size()));
  result.land = land;
  T oper;

  if (operation_on_pair_of_landscapesDBG) {
    for (size_t i = 0; i != std::min(land1.land.size(), land2.land.size()); ++i) {
      std::clog << "land1.land[" << i << "].size() : " << land1.land[i].size() << std::endl;
      std::clog << "land2.land[" << i << "].size() : " << land2.land[i].size() << std::endl;
    }
    getchar();
  }

  for (size_t i = 0; i != std::min(land1.land.size(), land2.land.size()); ++i) {
    std::vector<std::pair<double, double> > lambda_n;
    size_t p = 0;
    size_t q = 0;
    while ((p + 1 < land1.land[i].size()) && (q + 1 < land2.land[i].size())) {
      if (operation_on_pair_of_landscapesDBG) {
        std::clog << "p : " << p << "\n";
        std::clog << "q : " << q << "\n";
        std::clog << "land1.land.size() : " << land1.land.size() << std::endl;
        std::clog << "land2.land.size() : " << land2.land.size() << std::endl;
        std::clog << "land1.land[" << i << "].size() : " << land1.land[i].size() << std::endl;
        std::clog << "land2.land[" << i << "].size() : " << land2.land[i].size() << std::endl;
        std::clog << "land1.land[i][p].first : " << land1.land[i][p].first << "\n";
        std::clog << "land2.land[i][q].first : " << land2.land[i][q].first << "\n";
      }

      if (land1.land[i][p].first < land2.land[i][q].first) {
        if (operation_on_pair_of_landscapesDBG) {
          std::clog << "first \n";
          std::clog << " function_value(land2.land[i][q-1],land2.land[i][q],land1.land[i][p].first) : "
                    << function_value(land2.land[i][q - 1], land2.land[i][q], land1.land[i][p].first) << "\n";
        }
        lambda_n.push_back(
            std::make_pair(land1.land[i][p].first,
                           oper(static_cast<double>(land1.land[i][p].second),
                                function_value(land2.land[i][q - 1], land2.land[i][q], land1.land[i][p].first))));
        ++p;
        continue;
      }
      if (land1.land[i][p].first > land2.land[i][q].first) {
        if (operation_on_pair_of_landscapesDBG) {
          std::clog << "Second \n";
          std::clog << "function_value(" << land1.land[i][p - 1].first << " " << land1.land[i][p - 1].second << " ,"
                    << land1.land[i][p].first << " " << land1.land[i][p].second << ", " << land2.land[i][q].first
                    << " ) : " << function_value(land1.land[i][p - 1], land1.land[i][p - 1], land2.land[i][q].first)
                    << "\n";
          std::clog << "oper( " << function_value(land1.land[i][p], land1.land[i][p - 1], land2.land[i][q].first) << ","
                    << land2.land[i][q].second << " : "
                    << oper(land2.land[i][q].second,
                            function_value(land1.land[i][p], land1.land[i][p - 1], land2.land[i][q].first))
                    << "\n";
        }
        lambda_n.push_back(std::make_pair(
            land2.land[i][q].first, oper(function_value(land1.land[i][p], land1.land[i][p - 1], land2.land[i][q].first),
                                         land2.land[i][q].second)));
        ++q;
        continue;
      }
      if (land1.land[i][p].first == land2.land[i][q].first) {
        if (operation_on_pair_of_landscapesDBG) std::clog << "Third \n";
        lambda_n.push_back(
            std::make_pair(land2.land[i][q].first, oper(land1.land[i][p].second, land2.land[i][q].second)));
        ++p;
        ++q;
      }
      if (operation_on_pair_of_landscapesDBG) {
        std::clog << "Next iteration \n";
      }
    }
    while ((p + 1 < land1.land[i].size()) && (q + 1 >= land2.land[i].size())) {
      if (operation_on_pair_of_landscapesDBG) {
        std::clog << "New point : " << land1.land[i][p].first
                  << "  oper(land1.land[i][p].second,0) : " << oper(land1.land[i][p].second, 0) << std::endl;
      }
      lambda_n.push_back(std::make_pair(land1.land[i][p].first, oper(land1.land[i][p].second, 0)));
      ++p;
    }
    while ((p + 1 >= land1.land[i].size()) && (q + 1 < land2.land[i].size())) {
      if (operation_on_pair_of_landscapesDBG) {
        std::clog << "New point : " << land2.land[i][q].first
                  << " oper(0,land2.land[i][q].second) : " << oper(0, land2.land[i][q].second) << std::endl;
      }
      lambda_n.push_back(std::make_pair(land2.land[i][q].first, oper(0, land2.land[i][q].second)));
      ++q;
    }
    lambda_n.push_back(std::make_pair(std::numeric_limits<int>::max(), 0));
    // CHANGE
    // result.land[i] = lambda_n;
    result.land[i].swap(lambda_n);
  }
  if (land1.land.size() > std::min(land1.land.size(), land2.land.size())) {
    if (operation_on_pair_of_landscapesDBG) {
      std::clog << "land1.land.size() > std::min( land1.land.size() , land2.land.size() )" << std::endl;
    }
    for (size_t i = std::min(land1.land.size(), land2.land.size()); i != std::max(land1.land.size(), land2.land.size());
         ++i) {
      std::vector<std::pair<double, double> > lambda_n(land1.land[i]);
      for (size_t nr = 0; nr != land1.land[i].size(); ++nr) {
        lambda_n[nr] = std::make_pair(land1.land[i][nr].first, oper(land1.land[i][nr].second, 0));
      }
      // CHANGE
      // result.land[i] = lambda_n;
      result.land[i].swap(lambda_n);
    }
  }
  if (land2.land.size() > std::min(land1.land.size(), land2.land.size())) {
    if (operation_on_pair_of_landscapesDBG) {
      std::clog << "( land2.land.size() > std::min( land1.land.size() , land2.land.size() ) ) " << std::endl;
    }
    for (size_t i = std::min(land1.land.size(), land2.land.size()); i != std::max(land1.land.size(), land2.land.size());
         ++i) {
      std::vector<std::pair<double, double> > lambda_n(land2.land[i]);
      for (size_t nr = 0; nr != land2.land[i].size(); ++nr) {
        lambda_n[nr] = std::make_pair(land2.land[i][nr].first, oper(0, land2.land[i][nr].second));
      }
      // CHANGE
      // result.land[i] = lambda_n;
      result.land[i].swap(lambda_n);
    }
  }
  if (operation_on_pair_of_landscapesDBG) {
    std::clog << "operation_on_pair_of_landscapes END\n";
    std::cin.ignore();
  }
  return result;
}